

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

void __thiscall
cmConditionEvaluator::cmConditionEvaluator
          (cmConditionEvaluator *this,cmMakefile *makefile,cmListFileBacktrace *bt)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  PolicyStatus PVar3;
  
  this->Makefile = makefile;
  (this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var2 = (bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar1;
  (this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  (bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  PVar3 = cmMakefile::GetPolicyStatus(makefile,CMP0012,false);
  this->Policy12Status = PVar3;
  PVar3 = cmMakefile::GetPolicyStatus(makefile,CMP0054,false);
  this->Policy54Status = PVar3;
  PVar3 = cmMakefile::GetPolicyStatus(makefile,CMP0057,false);
  this->Policy57Status = PVar3;
  PVar3 = cmMakefile::GetPolicyStatus(makefile,CMP0064,false);
  this->Policy64Status = PVar3;
  PVar3 = cmMakefile::GetPolicyStatus(makefile,CMP0139,false);
  this->Policy139Status = PVar3;
  return;
}

Assistant:

cmConditionEvaluator::cmConditionEvaluator(cmMakefile& makefile,
                                           cmListFileBacktrace bt)
  : Makefile(makefile)
  , Backtrace(std::move(bt))
  , Policy12Status(makefile.GetPolicyStatus(cmPolicies::CMP0012))
  , Policy54Status(makefile.GetPolicyStatus(cmPolicies::CMP0054))
  , Policy57Status(makefile.GetPolicyStatus(cmPolicies::CMP0057))
  , Policy64Status(makefile.GetPolicyStatus(cmPolicies::CMP0064))
  , Policy139Status(makefile.GetPolicyStatus(cmPolicies::CMP0139))
{
}